

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoBinop<unsigned_int,unsigned_int>
          (Thread *this,BinopTrapFunc<unsigned_int,_unsigned_int> *f,Ptr *out_trap)

{
  uint uVar1;
  uint uVar2;
  RunResult RVar3;
  Ptr local_70;
  undefined1 local_58 [8];
  string msg;
  uint out;
  uint lhs;
  uint rhs;
  Ptr *out_trap_local;
  BinopTrapFunc<unsigned_int,_unsigned_int> *f_local;
  Thread *this_local;
  
  uVar1 = Pop<unsigned_int>(this);
  uVar2 = Pop<unsigned_int>(this);
  std::__cxx11::string::string((string *)local_58);
  RVar3 = (*f)(uVar2,uVar1,(uint *)(msg.field_2._M_local_buf + 0xc),(string *)local_58);
  if (RVar3 == Trap) {
    Trap::New(&local_70,this->store_,(string *)local_58,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=(out_trap,&local_70);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_70);
  }
  else {
    Push<unsigned_int>(this,msg.field_2._12_4_);
    this_local._4_4_ = Ok;
  }
  std::__cxx11::string::~string((string *)local_58);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoBinop(BinopTrapFunc<R, T> f, Trap::Ptr* out_trap) {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  T out;
  std::string msg;
  TRAP_IF(f(lhs, rhs, &out, &msg) == RunResult::Trap, msg);
  Push<R>(out);
  return RunResult::Ok;
}